

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O3

uint __thiscall
QFragmentMapData<QTextFragmentData>::findNode
          (QFragmentMapData<QTextFragmentData> *this,int k,uint field)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  puVar1 = *(uint **)this;
  uVar3 = *puVar1;
  if (uVar3 != 0) {
    do {
      uVar4 = (ulong)uVar3;
      if ((uint)k < puVar1[uVar4 * 8 + (ulong)field + 4]) {
        lVar2 = uVar4 * 8 + 1;
      }
      else {
        uVar5 = puVar1[uVar4 * 8 + (ulong)field + 4] + puVar1[uVar4 * 8 + (ulong)field + 5];
        bVar6 = (uint)k < uVar5;
        k = k - uVar5;
        if (bVar6) {
          return uVar3;
        }
        lVar2 = uVar4 * 8 + 2;
      }
      uVar3 = puVar1[lVar2];
    } while (uVar3 != 0);
  }
  return 0;
}

Assistant:

inline uint root() const {
        Q_ASSERT(!head->root || !fragment(head->root)->parent);
        return head->root;
    }